

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::copyPixels(OutputFile *this,InputFile *in)

{
  LineOrder LVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *pAVar7;
  LineOrder *pLVar8;
  Compression *pCVar9;
  LogicExc *this_00;
  InputFile *in_RSI;
  long in_RDI;
  int pixelDataSize;
  char *pixelData;
  stringstream _iex_throw_s_5;
  Box2i *dataWindow;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  Lock lock;
  Header *in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff450;
  int in_stack_fffffffffffff454;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffff458;
  Lock *in_stack_fffffffffffff460;
  int pixelDataSize_00;
  undefined4 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  Data *in_stack_fffffffffffff478;
  OutputStreamMutex *in_stack_fffffffffffff480;
  ChannelList *in_stack_fffffffffffff490;
  ChannelList *in_stack_fffffffffffff498;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  Compression CVar10;
  Header *in_stack_fffffffffffff558;
  int *in_stack_fffffffffffff618;
  char **in_stack_fffffffffffff620;
  undefined8 in_stack_fffffffffffff628;
  InputFile *in_stack_fffffffffffff630;
  stringstream local_988 [16];
  ostream local_978 [376];
  Box2i *local_800;
  stringstream local_7f8 [16];
  ostream local_7e8 [376];
  stringstream local_670 [16];
  ostream local_660 [376];
  stringstream local_4e8 [16];
  ostream local_4d8 [376];
  stringstream local_360 [16];
  ostream local_350 [376];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  const_iterator local_50;
  const_iterator local_48;
  Header *local_30;
  undefined8 local_28;
  InputFile *local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffff460,(Mutex *)in_stack_fffffffffffff458,
             SUB41((uint)in_stack_fffffffffffff454 >> 0x18,0));
  local_28 = *(undefined8 *)(in_RDI + 8);
  local_30 = InputFile::header(local_10);
  local_48._M_node =
       (_Base_ptr)
       Header::find(in_stack_fffffffffffff558,
                    (char *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  local_50._M_node = (_Base_ptr)Header::end(in_stack_fffffffffffff448);
  bVar3 = Imf_2_5::operator!=((ConstIterator *)
                              CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                              (ConstIterator *)in_stack_fffffffffffff448);
  if (bVar3) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar5 = std::operator<<(local_1c8,"Cannot copy pixels from image file \"");
    pcVar6 = InputFile::fileName((InputFile *)0x86fa85);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\" to image file \"");
    pcVar6 = fileName((OutputFile *)0x86fad9);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,
                    "\". The input file is tiled, but the output file is not. Try using TiledOutputFile::copyPixels instead."
                   );
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,local_1d8);
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Header::dataWindow((Header *)0x86fba6);
  Header::dataWindow((Header *)0x86fbbd);
  bVar3 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffff460,
                     in_stack_fffffffffffff458);
  if (!bVar3) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_360);
    poVar5 = std::operator<<(local_350,"Cannot copy pixels from image file \"");
    pcVar6 = InputFile::fileName((InputFile *)0x86fc39);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\" to image file \"");
    pcVar6 = fileName((OutputFile *)0x86fc8d);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\". The files have different data windows.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,local_360);
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pLVar8 = Header::lineOrder((Header *)0x86fd41);
  LVar1 = *pLVar8;
  pLVar8 = Header::lineOrder((Header *)0x86fd69);
  if (LVar1 != *pLVar8) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4e8);
    poVar5 = std::operator<<(local_4d8,"Quick pixel copy from image file \"");
    pcVar6 = InputFile::fileName((InputFile *)0x86fdcd);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\" to image file \"");
    pcVar6 = fileName((OutputFile *)0x86fe21);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\" failed. The files have different line orders.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,local_4e8);
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pCVar9 = Header::compression((Header *)0x86fed5);
  CVar10 = *pCVar9;
  pCVar9 = Header::compression((Header *)0x86fefd);
  if (CVar10 == *pCVar9) {
    Header::channels((Header *)0x870069);
    Header::channels((Header *)0x870080);
    bVar3 = ChannelList::operator==(in_stack_fffffffffffff498,in_stack_fffffffffffff490);
    if (!bVar3) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_7f8);
      poVar5 = std::operator<<(local_7e8,"Quick pixel copy from image file \"");
      pcVar6 = InputFile::fileName((InputFile *)0x8700fc);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\" to image file \"");
      pcVar6 = fileName((OutputFile *)0x870150);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,"\" failed.  The files have different channel lists.");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar7,local_7f8);
      __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    local_800 = Header::dataWindow((Header *)0x870204);
    if (*(int *)(*(long *)(in_RDI + 8) + 0x7c) == ((local_800->max).y - (local_800->min).y) + 1) {
      while (0 < *(int *)(*(long *)(in_RDI + 8) + 0x7c)) {
        InputFile::rawPixelData
                  (in_stack_fffffffffffff630,(int)((ulong)in_stack_fffffffffffff628 >> 0x20),
                   in_stack_fffffffffffff620,in_stack_fffffffffffff618);
        lVar2 = *(long *)(in_RDI + 8);
        pixelDataSize_00 = (int)((ulong)*(undefined8 *)(lVar2 + 0x138) >> 0x20);
        iVar4 = lineBufferMinY(*(int *)(lVar2 + 0x78),*(int *)(lVar2 + 0x8c),*(int *)(lVar2 + 0x120)
                              );
        anon_unknown_6::writePixelData
                  (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                   (int)((ulong)in_stack_fffffffffffff470 >> 0x20),
                   (char *)CONCAT44(iVar4,in_stack_fffffffffffff468),pixelDataSize_00);
        if (*(int *)(*(long *)(in_RDI + 8) + 0x80) == 0) {
          in_stack_fffffffffffff454 = *(int *)(*(long *)(in_RDI + 8) + 0x120);
        }
        else {
          in_stack_fffffffffffff454 = -*(int *)(*(long *)(in_RDI + 8) + 0x120);
        }
        *(int *)(*(long *)(in_RDI + 8) + 0x78) =
             in_stack_fffffffffffff454 + *(int *)(*(long *)(in_RDI + 8) + 0x78);
        *(int *)(*(long *)(in_RDI + 8) + 0x7c) =
             *(int *)(*(long *)(in_RDI + 8) + 0x7c) - *(int *)(*(long *)(in_RDI + 8) + 0x120);
      }
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450));
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_988);
    poVar5 = std::operator<<(local_978,"Quick pixel copy from image file \"");
    pcVar6 = InputFile::fileName((InputFile *)0x870288);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\" to image file \"");
    pcVar6 = fileName((OutputFile *)0x8702ca);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\" failed. \"");
    pcVar6 = fileName((OutputFile *)0x87030c);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\" already contains pixel data.");
    this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_00,local_988);
    __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_670);
  poVar5 = std::operator<<(local_660,"Quick pixel copy from image file \"");
  pcVar6 = InputFile::fileName((InputFile *)0x86ff61);
  poVar5 = std::operator<<(poVar5,pcVar6);
  poVar5 = std::operator<<(poVar5,"\" to image file \"");
  pcVar6 = fileName((OutputFile *)0x86ffb5);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\" failed. The files use different compression methods.");
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar7,local_670);
  __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
OutputFile::copyPixels (InputFile &in)
{
    Lock lock (*_data->_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header();

    if (inHdr.find("tiles") != inHdr.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The input file is tiled, but the output file is "
                            "not. Try using TiledOutputFile::copyPixels "
                            "instead.");

    if (!(hdr.dataWindow() == inHdr.dataWindow()))
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed.  "
			    "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i &dataWindow = hdr.dataWindow();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
	THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
			      "file \"" << in.fileName() << "\" to image "
			      "file \"" << fileName() << "\" failed. "
			      "\"" << fileName() << "\" already contains "
			      "pixel data.");

    //
    // Copy the pixel data.
    //

    while (_data->missingScanLines > 0)
    {
	const char *pixelData;
	int pixelDataSize;

	in.rawPixelData (_data->currentScanLine, pixelData, pixelDataSize);

        writePixelData (_data->_streamData, _data, lineBufferMinY (_data->currentScanLine,
                                               _data->minY,
                                               _data->linesInBuffer),
                        pixelData, pixelDataSize);

	_data->currentScanLine += (_data->lineOrder == INCREASING_Y)?
				   _data->linesInBuffer: -_data->linesInBuffer;

	_data->missingScanLines -= _data->linesInBuffer;
    }
}